

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O0

void __thiscall
Script_SetStackData_kOpPushData2_error_Test::TestBody
          (Script_SetStackData_kOpPushData2_error_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *message;
  char *in_R9;
  string local_100;
  AssertHelper local_e0;
  Message local_d8;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  undefined1 local_78 [8];
  Script script;
  allocator<unsigned_char> local_2a;
  value_type local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Script_SetStackData_kOpPushData2_error_Test *this_local;
  
  local_29 = 0xff;
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_2a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_28,2,&local_29,&local_2a)
  ;
  std::allocator<unsigned_char>::~allocator(&local_2a);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_28,0);
  *pvVar2 = 'M';
  cfd::core::ByteData::ByteData
            ((ByteData *)&cfd_except,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  cfd::core::Script::Script((Script *)local_78,(ByteData *)&cfd_except);
  cfd::core::ByteData::~ByteData((ByteData *)&cfd_except);
  cfd::core::Script::~Script((Script *)local_78);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_28);
  local_c9 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c8,&local_c9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_100,(internal *)local_c8,(AssertionResult *)0x6a1824,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_script.cpp"
               ,0xd6,message);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  return;
}

Assistant:

TEST(Script, SetStackData_kOpPushData2_error) {
  try {
    std::vector<uint8_t> bytes(2, 0xff);
    bytes[0] = 0x4d;
    Script script(bytes);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "OP_PUSHDATA2 is incorrect size.");
    return;
  }
  ASSERT_TRUE(false);
}